

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

seconds __thiscall CConnman::GetMaxOutboundTimeLeftInCycle_(CConnman *this)

{
  long lVar1;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar2;
  seconds sVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->nMaxOutboundLimit == 0) {
    sVar3.__r = 0;
  }
  else {
    lVar4 = (this->nMaxOutboundCycleStartTime).__r;
    if (lVar4 == 0) {
      sVar3.__r = 0x15180;
    }
    else {
      lVar4 = lVar4 + 0x15180;
      tVar2 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
      sVar3.__r = 0;
      if ((long)tVar2.__d.__r <= lVar4) {
        sVar3.__r = lVar4 - (long)tVar2.__d.__r;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (seconds)sVar3.__r;
}

Assistant:

std::chrono::seconds CConnman::GetMaxOutboundTimeLeftInCycle_() const
{
    AssertLockHeld(m_total_bytes_sent_mutex);

    if (nMaxOutboundLimit == 0)
        return 0s;

    if (nMaxOutboundCycleStartTime.count() == 0)
        return MAX_UPLOAD_TIMEFRAME;

    const std::chrono::seconds cycleEndTime = nMaxOutboundCycleStartTime + MAX_UPLOAD_TIMEFRAME;
    const auto now = GetTime<std::chrono::seconds>();
    return (cycleEndTime < now) ? 0s : cycleEndTime - now;
}